

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

size_t secp256k1_pippenger_max_points(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ushort uVar7;
  long lVar8;
  
  sVar1 = secp256k1_scratch_max_allocation(error_callback,scratch,6);
  lVar8 = 1;
  uVar7 = 0x81;
  uVar6 = 0;
  while( true ) {
    if (lVar8 == 0xd) {
      return uVar6;
    }
    uVar3 = (ulong)(byte)(uVar7 / (byte)((char)uVar7 + 0x81));
    uVar4 = (0x98L << ((byte)lVar8 & 0x3f)) + uVar3 * 8 + 0x148;
    if (sVar1 < uVar4) break;
    sVar2 = secp256k1_pippenger_bucket_window_inv((int)lVar8);
    uVar3 = (sVar1 - uVar4) / (uVar3 * 8 + 0x138);
    sVar5 = sVar2;
    if (uVar3 < sVar2) {
      sVar5 = uVar3;
    }
    if (uVar6 < sVar5) {
      uVar6 = sVar5;
    }
    uVar7 = (ushort)(byte)((char)uVar7 + 1);
    lVar8 = lVar8 + 1;
    if (uVar3 < sVar2) {
      return uVar6;
    }
  }
  return uVar6;
}

Assistant:

static size_t secp256k1_pippenger_max_points(const secp256k1_callback* error_callback, secp256k1_scratch *scratch) {
    size_t max_alloc = secp256k1_scratch_max_allocation(error_callback, scratch, PIPPENGER_SCRATCH_OBJECTS);
    int bucket_window;
    size_t res = 0;

    for (bucket_window = 1; bucket_window <= PIPPENGER_MAX_BUCKET_WINDOW; bucket_window++) {
        size_t n_points;
        size_t max_points = secp256k1_pippenger_bucket_window_inv(bucket_window);
        size_t space_for_points;
        size_t space_overhead;
        size_t entry_size = sizeof(secp256k1_ge) + sizeof(secp256k1_scalar) + sizeof(struct secp256k1_pippenger_point_state) + (WNAF_SIZE(bucket_window+1)+1)*sizeof(int);

        entry_size = 2*entry_size;
        space_overhead = (sizeof(secp256k1_gej) << bucket_window) + entry_size + sizeof(struct secp256k1_pippenger_state);
        if (space_overhead > max_alloc) {
            break;
        }
        space_for_points = max_alloc - space_overhead;

        n_points = space_for_points/entry_size;
        n_points = n_points > max_points ? max_points : n_points;
        if (n_points > res) {
            res = n_points;
        }
        if (n_points < max_points) {
            /* A larger bucket_window may support even more points. But if we
             * would choose that then the caller couldn't safely use any number
             * smaller than what this function returns */
            break;
        }
    }
    return res;
}